

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzcheckmesh.cpp
# Opt level: O2

int __thiscall TPZCheckMesh::VerifyAllConnects(TPZCheckMesh *this)

{
  int iVar1;
  ostream *poVar2;
  int connect;
  int iVar3;
  int iVar4;
  
  iVar3 = (int)(this->fMesh->fConnectVec).super_TPZChunkVector<TPZConnect,_10>.fNElements;
  connect = 0;
  if (iVar3 < 1) {
    iVar3 = 0;
  }
  iVar4 = 1;
  do {
    if (iVar3 == connect) {
      return iVar4;
    }
    iVar1 = VerifyConnect(this,connect);
    if (iVar1 == 0) {
LAB_00ff7baa:
      poVar2 = std::operator<<(this->fOut,"Check failed for connect: ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,connect);
      std::endl<char,std::char_traits<char>>(poVar2);
      iVar4 = 0;
    }
    else {
      iVar1 = VerifyCompatibilityBetweenNShapesAndBlockSize(this,connect);
      if (iVar1 == 0) goto LAB_00ff7baa;
    }
    connect = connect + 1;
  } while( true );
}

Assistant:

int TPZCheckMesh::VerifyAllConnects() {
	int ncon = fMesh->NConnects();
	int i;
	int check = 1;
	for (i=0; i<ncon; i++){
		//(*fOut) << "Startint to check consistency for connect " << i << endl;
		if (!VerifyConnect(i) || !VerifyCompatibilityBetweenNShapesAndBlockSize(i)) {
			check = 0;
			(*fOut) << "Check failed for connect: " << i << endl;
		}
	}
	return check;
}